

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_> * __thiscall
cmLocalGenerator::AddUnityFilesModeGroup
          (vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
           *__return_storage_ptr__,cmLocalGenerator *this,cmGeneratorTarget *target,string *lang,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configs,vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                   *filtered_sources,cmValue beforeInclude,cmValue afterInclude,
          string *filename_base)

{
  cmSourceFile *this_00;
  initializer_list<cmLocalGenerator::UnityBatchedSource> __l;
  undefined8 args;
  bool bVar1;
  string *psVar2;
  pointer ppVar3;
  reference ppVar4;
  cmRange<__gnu_cxx::__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>
  cVar5;
  UnityBatchedSource *local_2c0;
  string local_278;
  cmValue local_258;
  cmValue local_250;
  cmRange<__gnu_cxx::__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>
  local_248;
  UnitySource local_238;
  char *local_210;
  cmAlphaNum local_208;
  cmAlphaNum local_1d8;
  undefined1 local_1a8 [8];
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
  *item;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>_>
  *__range1_1;
  allocator<cmLocalGenerator::UnityBatchedSource> local_149;
  UnityBatchedSource *local_148;
  undefined1 local_140 [32];
  undefined1 local_120 [24];
  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
  sources;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>,_true>
  local_f0;
  iterator i;
  allocator<char> local_d1;
  string local_d0;
  cmValue local_b0;
  cmValue value;
  UnityBatchedSource *ubs;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
  *__range1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>_>
  explicit_mapping;
  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
  *filtered_sources_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configs_local;
  string *lang_local;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *this_local;
  cmValue afterInclude_local;
  cmValue beforeInclude_local;
  vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_> *unity_files
  ;
  
  explicit_mapping._M_h._M_single_bucket._7_1_ = 0;
  std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::vector
            (__return_storage_ptr__);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>_>
                   *)&__range1);
  __end1 = std::
           vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
           ::begin(filtered_sources);
  ubs = (UnityBatchedSource *)
        std::
        vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
        ::end(filtered_sources);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
                                     *)&ubs), bVar1) {
    value.Value = (string *)
                  __gnu_cxx::
                  __normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
                  ::operator*(&__end1);
    this_00 = *(cmSourceFile **)value.Value;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"UNITY_GROUP",&local_d1);
    local_b0 = cmSourceFile::GetProperty(this_00,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    bVar1 = cmValue::operator_cast_to_bool(&local_b0);
    if (bVar1) {
      psVar2 = cmValue::operator*[abi_cxx11_(&local_b0);
      local_f0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>_>
                   *)&__range1,psVar2);
      sources.
      super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>_>
                    ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>_>
                           *)&__range1);
      bVar1 = std::__detail::operator==
                        (&local_f0,
                         (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>,_true>
                          *)&sources.
                             super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        local_148 = (UnityBatchedSource *)local_140;
        UnityBatchedSource::UnityBatchedSource(local_148,(UnityBatchedSource *)value.Value);
        local_120._0_8_ = local_140;
        local_120._8_8_ = (pointer)0x1;
        std::allocator<cmLocalGenerator::UnityBatchedSource>::allocator(&local_149);
        __l._M_len = local_120._8_8_;
        __l._M_array = (iterator)local_120._0_8_;
        std::
        vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
        ::vector((vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                  *)(local_120 + 0x10),__l,&local_149);
        std::allocator<cmLocalGenerator::UnityBatchedSource>::~allocator(&local_149);
        local_2c0 = (UnityBatchedSource *)local_120;
        do {
          local_2c0 = local_2c0 + -1;
          UnityBatchedSource::~UnityBatchedSource(local_2c0);
        } while (local_2c0 != (UnityBatchedSource *)local_140);
        psVar2 = cmValue::operator*[abi_cxx11_(&local_b0);
        std::
        unordered_map<std::__cxx11::string,std::vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>>>>
        ::
        emplace<std::__cxx11::string_const&,std::vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>>
                  ((unordered_map<std::__cxx11::string,std::vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>>>>
                    *)&__range1,psVar2,
                   (vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                    *)(local_120 + 0x10));
        std::
        vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
        ::~vector((vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                   *)(local_120 + 0x10));
      }
      else {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>,_false,_true>
                               *)&local_f0);
        std::
        vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>
        ::emplace_back<cmLocalGenerator::UnityBatchedSource_const&>
                  ((vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>
                    *)&ppVar3->second,(UnityBatchedSource *)value.Value);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>_>
             ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>_>
                      *)&__range1);
  item = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
          *)std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>_>
            ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>_>
                   *)&__range1);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1_1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>,_true>
                       ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>,_true>
                         *)&item);
    if (!bVar1) break;
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>,_false,_true>
             ::operator*(&__end1_1);
    filename.field_2._8_8_ = ppVar4;
    cmAlphaNum::cmAlphaNum(&local_1d8,filename_base);
    cmAlphaNum::cmAlphaNum(&local_208,"unity_");
    args = filename.field_2._8_8_;
    bVar1 = std::operator==(lang,"C");
    local_210 = "_cxx.cxx";
    if (bVar1) {
      local_210 = "_c.c";
    }
    cmStrCat<std::__cxx11::string,char_const*>
              ((string *)local_1a8,&local_1d8,&local_208,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,&local_210)
    ;
    cVar5 = cmMakeRange<std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
                      (&ppVar4->second);
    local_250.Value = beforeInclude.Value;
    local_258.Value = afterInclude.Value;
    local_248 = cVar5;
    std::__cxx11::string::string((string *)&local_278,(string *)local_1a8);
    WriteUnitySource(&local_238,this,target,configs,local_248,local_250,local_258,&local_278);
    std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
    emplace_back<cmLocalGenerator::UnitySource>(__return_storage_ptr__,&local_238);
    UnitySource::~UnitySource(&local_238);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)local_1a8);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>,_false,_true>
    ::operator++(&__end1_1);
  }
  explicit_mapping._M_h._M_single_bucket._7_1_ = 1;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>_>
                    *)&__range1);
  if ((explicit_mapping._M_h._M_single_bucket._7_1_ & 1) == 0) {
    std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
    ~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmLocalGenerator::UnitySource>
cmLocalGenerator::AddUnityFilesModeGroup(
  cmGeneratorTarget* target, std::string const& lang,
  std::vector<std::string> const& configs,
  std::vector<UnityBatchedSource> const& filtered_sources,
  cmValue beforeInclude, cmValue afterInclude,
  std::string const& filename_base)
{
  std::vector<UnitySource> unity_files;

  // sources organized by group name. Drop any source
  // without a group
  std::unordered_map<std::string, std::vector<UnityBatchedSource>>
    explicit_mapping;
  for (UnityBatchedSource const& ubs : filtered_sources) {
    if (cmValue value = ubs.Source->GetProperty("UNITY_GROUP")) {
      auto i = explicit_mapping.find(*value);
      if (i == explicit_mapping.end()) {
        std::vector<UnityBatchedSource> sources{ ubs };
        explicit_mapping.emplace(*value, std::move(sources));
      } else {
        i->second.emplace_back(ubs);
      }
    }
  }

  for (auto const& item : explicit_mapping) {
    auto const& name = item.first;
    std::string filename = cmStrCat(filename_base, "unity_", name,
                                    (lang == "C") ? "_c.c" : "_cxx.cxx");
    unity_files.emplace_back(this->WriteUnitySource(
      target, configs, cmMakeRange(item.second), beforeInclude, afterInclude,
      std::move(filename)));
  }

  return unity_files;
}